

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedBase.cpp
# Opt level: O0

bool __thiscall
glcts::DrawBuffersIndexedBase::BlendMaskStateMachine::CheckEnumGeneral
          (BlendMaskStateMachine *this,GLenum e,GLenum s)

{
  MessageBuilder *pMVar1;
  MessageBuilder local_1b8;
  float local_38;
  GLboolean local_31;
  GLfloat f;
  GLboolean b;
  GLint64 li;
  GLfloat local_20;
  GLint i;
  GLenum s_local;
  GLenum e_local;
  BlendMaskStateMachine *this_local;
  
  local_20 = (GLfloat)s;
  i = e;
  _s_local = this;
  (*this->gl->getIntegerv)(e,(GLint *)((long)&li + 4));
  (*this->gl->getInteger64v)(i,(GLint64 *)&f);
  (*this->gl->getBooleanv)(i,&local_31);
  (*this->gl->getFloatv)(i,&local_38);
  if ((((li._4_4_ == local_20) && (f == local_20)) && ((GLfloat)(long)local_38 == local_20)) &&
     ((bool)local_31 == (local_20 != 0.0))) {
    this_local._7_1_ = true;
  }
  else {
    tcu::TestLog::operator<<(&local_1b8,this->testLog,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar1 = tcu::MessageBuilder::operator<<
                       (&local_1b8,(char (*) [32])"General state should be set to ");
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(uint *)&local_20);
    pMVar1 = tcu::MessageBuilder::operator<<
                       (pMVar1,(char (*) [34])" but found the following values:\n");
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [6])0x2b020cb);
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(int *)((long)&li + 4));
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [2])0x2b9e07b);
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [8])"int64: ");
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(long *)&f);
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [2])0x2b9e07b);
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [7])0x2b3cb18);
    pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_31);
    tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b8);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool DrawBuffersIndexedBase::BlendMaskStateMachine::CheckEnumGeneral(glw::GLenum e, glw::GLenum s)
{
	glw::GLint	 i;
	glw::GLint64   li;
	glw::GLboolean b;
	glw::GLfloat   f;

	gl.getIntegerv(e, &i);
	gl.getInteger64v(e, &li);
	gl.getBooleanv(e, &b);
	gl.getFloatv(e, &f);
	if ((static_cast<glw::GLenum>(i) != s) || (static_cast<glw::GLenum>(li) != s) ||
		(static_cast<glw::GLenum>(f) != s) || (b != (s ? GL_TRUE : GL_FALSE)))
	{
		testLog << tcu::TestLog::Message << "General state should be set to " << s
				<< " but found the following values:\n"
				<< "int: " << i << "\n"
				<< "int64: " << li << "\n"
				<< "bool: " << b << tcu::TestLog::EndMessage;
		return false;
	}
	return true;
}